

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64_t max_value,uint64_t *output)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  
  pbVar3 = (byte *)(text->_M_dataplus)._M_p;
  if (*pbVar3 == 0x30) {
    if ((pbVar3[1] | 0x20) == 0x78) {
      pbVar3 = pbVar3 + 2;
      uVar4 = 0x1000000000000000;
      uVar6 = 0x10;
    }
    else {
      uVar4 = 0x2000000000000000;
      uVar6 = 8;
    }
  }
  else {
    uVar4 = 0x199999999999999a;
    uVar6 = 10;
  }
  uVar7 = 0;
  do {
    uVar9 = (ulong)*pbVar3;
    iVar5 = (int)uVar6;
    if (uVar9 == 0) goto LAB_002eb099;
    pbVar3 = pbVar3 + 1;
    cVar1 = "$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$"[uVar9];
    uVar10 = (long)cVar1;
    if (uVar9 == 0x30) {
      uVar10 = uVar7;
    }
    if (cVar1 < iVar5) {
      uVar7 = uVar10;
    }
    cVar8 = (uVar9 != 0x30) * '\x03';
    if (iVar5 <= cVar1) {
      cVar8 = '\x01';
    }
  } while (cVar8 == '\0');
  if (cVar8 == '\x03') {
LAB_002eb099:
    bVar2 = *pbVar3;
    while (bVar2 != 0) {
      pbVar3 = pbVar3 + 1;
      if (iVar5 <= "$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$"[bVar2]) {
        return false;
      }
      if (uVar4 <= uVar7) {
        return false;
      }
      uVar7 = (ulong)(uint)(int)"$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$"[bVar2] +
              uVar7 * uVar6;
      if (uVar7 < uVar6) {
        return false;
      }
      bVar2 = *pbVar3;
    }
    if (uVar7 <= max_value) {
      *output = uVar7;
      return true;
    }
  }
  return false;
}

Assistant:

Tokenizer::Tokenizer(ZeroCopyInputStream* input,
                     ErrorCollector* error_collector)
    : input_(input),
      error_collector_(error_collector),
      buffer_(nullptr),
      buffer_size_(0),
      buffer_pos_(0),
      read_error_(false),
      line_(0),
      column_(0),
      record_target_(nullptr),
      record_start_(-1),
      allow_f_after_float_(false),
      comment_style_(CPP_COMMENT_STYLE),
      require_space_after_number_(true),
      allow_multiline_strings_(false) {
  current_.line = 0;
  current_.column = 0;
  current_.end_column = 0;
  current_.type = TYPE_START;
  previous_ = current_;

  Refresh();
}